

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O3

int Cudd_ApaPrintDecimal(FILE *fp,int digits,DdApaNumber number)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  void *__dest;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  
  __dest = malloc((long)digits << 2);
  if (__dest == (void *)0x0) {
    iVar9 = 0;
  }
  else {
    uVar7 = (uint)((double)digits * 9.632959861247398);
    __ptr = malloc((long)(int)(uVar7 + 1));
    if (__ptr == (void *)0x0) {
      iVar9 = 0;
      __ptr = __dest;
    }
    else {
      if (0 < digits) {
        memcpy(__dest,number,(ulong)(uint)digits * 4);
      }
      if ((int)uVar7 < 0) {
        free(__dest);
      }
      else {
        uVar8 = (ulong)uVar7;
        do {
          if (digits < 1) {
            lVar5 = 0;
          }
          else {
            uVar10 = 0;
            lVar5 = 0;
            do {
              uVar4 = lVar5 << 0x20 | (ulong)*(uint *)((long)__dest + uVar10 * 4);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = uVar4;
              uVar6 = SUB168(auVar1 * ZEXT816(0x6666666666666667),8) >> 2;
              *(int *)((long)__dest + uVar10 * 4) = (int)uVar6;
              lVar5 = uVar4 + uVar6 * -10;
              uVar10 = uVar10 + 1;
            } while ((uint)digits != uVar10);
          }
          *(char *)((long)__ptr + uVar8) = (char)lVar5;
          bVar11 = 0 < (long)uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar11);
        free(__dest);
        bVar11 = true;
        uVar8 = 0;
        iVar9 = 0;
        do {
          bVar2 = !bVar11;
          bVar11 = false;
          if (((bVar2) ||
              (bVar11 = *(char *)((long)__ptr + uVar8) == '\0', !bVar11 || uVar7 == uVar8)) &&
             (iVar3 = fprintf((FILE *)fp,"%1d"), iVar3 == -1)) goto LAB_007c5611;
          uVar8 = uVar8 + 1;
        } while (uVar7 + 1 != uVar8);
      }
      iVar9 = 1;
    }
LAB_007c5611:
    free(__ptr);
  }
  return iVar9;
}

Assistant:

int
Cudd_ApaPrintDecimal(
  FILE * fp,
  int  digits,
  DdApaNumber  number)
{
    int i, result;
    DdApaDigit remainder;
    DdApaNumber work;
    unsigned char *decimal;
    int leadingzero;
    int decimalDigits = (int) (digits * log10((double) DD_APA_BASE)) + 1;

    work = Cudd_NewApaNumber(digits);
    if (work == NULL)
        return(0);
    decimal = ABC_ALLOC(unsigned char, decimalDigits);
    if (decimal == NULL) {
        ABC_FREE(work);
        return(0);
    }
    Cudd_ApaCopy(digits,number,work);
    for (i = decimalDigits - 1; i >= 0; i--) {
        remainder = Cudd_ApaShortDivision(digits,work,(DdApaDigit) 10,work);
        decimal[i] = (unsigned char) remainder;
    }
    ABC_FREE(work);

    leadingzero = 1;
    for (i = 0; i < decimalDigits; i++) {
        leadingzero = leadingzero && (decimal[i] == 0);
        if ((!leadingzero) || (i == (decimalDigits - 1))) {
            result = fprintf(fp,"%1d",decimal[i]);
            if (result == EOF) {
                ABC_FREE(decimal);
                return(0);
            }
        }
    }
    ABC_FREE(decimal);
    return(1);

}